

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetScrollFromPosY(ImGuiWindow *window,float param_2,float center_y_ratio)

{
  float fVar1;
  float fVar2;
  
  fVar1 = ImGuiWindow::TitleBarHeight(window);
  fVar2 = ImGuiWindow::MenuBarHeight(window);
  (window->ScrollTarget).y = (float)(int)((param_2 - (fVar2 + fVar1)) + (window->Scroll).y);
  (window->ScrollTargetCenterRatio).y = center_y_ratio;
  (window->ScrollTargetEdgeSnapDist).y = 0.0;
  return;
}

Assistant:

void ImGui::SetScrollFromPosY(ImGuiWindow* window, float local_y, float center_y_ratio)
{
    IM_ASSERT(center_y_ratio >= 0.0f && center_y_ratio <= 1.0f);
    local_y -= window->TitleBarHeight() + window->MenuBarHeight(); // FIXME: Would be nice to have a more standardized access to our scrollable/client rect
    window->ScrollTarget.y = IM_FLOOR(local_y + window->Scroll.y); // Convert local position to scroll offset
    window->ScrollTargetCenterRatio.y = center_y_ratio;
    window->ScrollTargetEdgeSnapDist.y = 0.0f;
}